

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.hpp
# Opt level: O0

double extract_spC<PredictionData<float,unsigned_long>>
                 (PredictionData<float,_unsigned_long> *prediction_data,size_t row,size_t col_num)

{
  unsigned_long *puVar1;
  unsigned_long *in_RDX;
  unsigned_long *in_RSI;
  unsigned_long *in_RDI;
  unsigned_long *search_res;
  double local_8;
  
  puVar1 = std::lower_bound<unsigned_long*,unsigned_long>(in_RDI,in_RSI,in_RDX);
  if ((puVar1 == (unsigned_long *)(in_RDI[7] + *(long *)(in_RDI[8] + 8 + (long)in_RDX * 8) * 8)) ||
     ((unsigned_long *)*puVar1 != in_RSI)) {
    local_8 = 0.0;
  }
  else {
    local_8 = (double)*(float *)(in_RDI[6] + ((long)((long)puVar1 - in_RDI[7]) >> 3) * 4);
  }
  return local_8;
}

Assistant:

double extract_spC(const PredictionData &prediction_data, size_t row, size_t col_num) noexcept
{
    const decltype(prediction_data.Xc_indptr)
               search_res = std::lower_bound(prediction_data.Xc_ind + prediction_data.Xc_indptr[col_num],
                                             prediction_data.Xc_ind + prediction_data.Xc_indptr[col_num + 1],
                                             row);
    if (
        search_res == (prediction_data.Xc_ind + prediction_data.Xc_indptr[col_num + 1])
            ||
        (*search_res) != static_cast<typename std::remove_pointer<decltype(search_res)>::type>(row)
        )
        return 0.;
    else
        return prediction_data.Xc[search_res - prediction_data.Xc_ind];
}